

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_assq_op(sexp ctx,sexp self,sexp_sint_t n,sexp x,sexp ls)

{
  sexp psVar1;
  
  while( true ) {
    if ((((ulong)ls & 3) != 0) || (ls->tag != 6)) {
      return (sexp)&DAT_0000003e;
    }
    psVar1 = (ls->value).type.name;
    if ((((ulong)psVar1 & 3) == 0) && ((psVar1->tag == 6 && ((psVar1->value).type.name == x))))
    break;
    ls = (ls->value).type.cpl;
  }
  return psVar1;
}

Assistant:

sexp sexp_assq_op (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp ls) {
  while (sexp_pairp(ls))
    if (sexp_pairp(sexp_car(ls)) && (x == sexp_caar(ls)))
      return sexp_car(ls);
    else
      ls = sexp_cdr(ls);
  return SEXP_FALSE;
}